

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

int COVER_cmp8(COVER_ctx_t *ctx,void *lp,void *rp)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = ~(-1L << ((char)ctx->d * '\b' & 0x3fU));
  if (ctx->d == 8) {
    uVar3 = 0xffffffffffffffff;
  }
  uVar2 = *(ulong *)(ctx->samples + *lp) & uVar3;
  uVar3 = uVar3 & *(ulong *)(ctx->samples + *rp);
  uVar1 = 0xffffffff;
  if (uVar3 <= uVar2) {
    uVar1 = (uint)(uVar3 < uVar2);
  }
  return uVar1;
}

Assistant:

static int COVER_cmp8(COVER_ctx_t *ctx, const void *lp, const void *rp) {
  U64 const mask = (ctx->d == 8) ? (U64)-1 : (((U64)1 << (8 * ctx->d)) - 1);
  U64 const lhs = MEM_readLE64(ctx->samples + *(U32 const *)lp) & mask;
  U64 const rhs = MEM_readLE64(ctx->samples + *(U32 const *)rp) & mask;
  if (lhs < rhs) {
    return -1;
  }
  return (lhs > rhs);
}